

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O2

bool __thiscall dxil_spv::MemoryStream::map_string_iterate(MemoryStream *this,char **str)

{
  bool bVar1;
  undefined8 in_RAX;
  char c;
  undefined8 uStack_18;
  
  *str = (char *)(this->blob + this->blob_offset);
  uStack_18 = in_RAX;
  do {
    bVar1 = read<char>(this,(char *)((long)&uStack_18 + 7));
    if (!bVar1) {
      return bVar1;
    }
  } while (uStack_18._7_1_ != '\0');
  return bVar1;
}

Assistant:

bool MemoryStream::map_string_iterate(const char *&str)
{
	// Strings are C strings and can be mapped 1:1.
	// Just need to verify they terminate properly.
	str = reinterpret_cast<const char *>(blob + blob_offset);
	char c;

	do
	{
		if (!read(c))
			return false;
		else if (c == '\0')
			break;
	} while (c != '\0');

	return true;
}